

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O3

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  pointer psVar1;
  abstract_message_box_t *paVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  state_t *psVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  agent_t *paVar9;
  long lVar10;
  pointer o;
  pointer this_00;
  iterator iVar11;
  long lVar12;
  long lVar6;
  
  iVar5 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  this_00 = (this->m_events).
            super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_events).
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)psVar1 - (long)this_00;
  lVar8 = lVar7;
  if (0 < lVar7 >> 8) {
    lVar12 = (lVar7 >> 8) + 1;
    lVar8 = 0;
    do {
      lVar10 = lVar8;
      lVar8 = (**(code **)(**(long **)((long)&(this_00->m_mbox).m_obj + lVar10) + 0x10))();
      if ((lVar8 == lVar6) &&
         (bVar4 = std::type_index::operator==
                            ((type_index *)((long)&(this_00->m_msg_type)._M_target + lVar10),
                             msg_type), bVar4)) {
        this_00 = (pointer)((long)&(this_00->m_mbox).m_obj + lVar10);
        goto LAB_001ff1c4;
      }
      lVar8 = (**(code **)(**(long **)((long)&this_00[1].m_mbox.m_obj + lVar10) + 0x10))();
      if ((lVar8 == lVar6) &&
         (bVar4 = std::type_index::operator==
                            ((type_index *)((long)&this_00[1].m_msg_type._M_target + lVar10),
                             msg_type), bVar4)) {
        this_00 = (pointer)((long)&this_00[1].m_mbox.m_obj + lVar10);
        goto LAB_001ff1c4;
      }
      lVar8 = (**(code **)(**(long **)((long)&this_00[2].m_mbox.m_obj + lVar10) + 0x10))();
      if ((lVar8 == lVar6) &&
         (bVar4 = std::type_index::operator==
                            ((type_index *)((long)&this_00[2].m_msg_type._M_target + lVar10),
                             msg_type), bVar4)) {
        this_00 = (pointer)((long)&this_00[2].m_mbox.m_obj + lVar10);
        goto LAB_001ff1c4;
      }
      lVar8 = (**(code **)(**(long **)((long)&this_00[3].m_mbox.m_obj + lVar10) + 0x10))();
      if ((lVar8 == lVar6) &&
         (bVar4 = std::type_index::operator==
                            ((type_index *)((long)&this_00[3].m_msg_type._M_target + lVar10),
                             msg_type), bVar4)) {
        this_00 = (pointer)((long)&this_00[3].m_mbox.m_obj + lVar10);
        goto LAB_001ff1c4;
      }
      lVar12 = lVar12 + -1;
      lVar8 = lVar10 + 0x100;
    } while (1 < lVar12);
    this_00 = (pointer)((long)&this_00[4].m_mbox.m_obj + lVar10);
    lVar8 = lVar7 - (lVar10 + 0x100);
  }
  lVar8 = lVar8 >> 6;
  iVar11._M_current = psVar1;
  if (lVar8 == 1) {
LAB_001ff17a:
    iVar5 = (*((this_00->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
    if ((CONCAT44(extraout_var_02,iVar5) != lVar6) ||
       (bVar4 = std::type_index::operator==(&this_00->m_msg_type,msg_type), !bVar4))
    goto LAB_001ff234;
  }
  else if (lVar8 == 2) {
LAB_001ff157:
    iVar5 = (*((this_00->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
    if ((CONCAT44(extraout_var_01,iVar5) != lVar6) ||
       (bVar4 = std::type_index::operator==(&this_00->m_msg_type,msg_type), !bVar4)) {
      this_00 = this_00 + 1;
      goto LAB_001ff17a;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_001ff234;
    iVar5 = (*((this_00->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
    if ((CONCAT44(extraout_var_00,iVar5) != lVar6) ||
       (bVar4 = std::type_index::operator==(&this_00->m_msg_type,msg_type), !bVar4)) {
      this_00 = this_00 + 1;
      goto LAB_001ff157;
    }
  }
LAB_001ff1c4:
  o = this_00 + 1;
  iVar11._M_current = this_00;
  if (o != psVar1 && this_00 != psVar1) {
    do {
      iVar5 = (*((o->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
      if ((CONCAT44(extraout_var_03,iVar5) != lVar6) ||
         (bVar4 = std::type_index::operator==(&o->m_msg_type,msg_type), !bVar4)) {
        intrusive_ptr_t<so_5::abstract_message_box_t>::operator=(&this_00->m_mbox,&o->m_mbox);
        psVar3 = o->m_state;
        (this_00->m_msg_type)._M_target = (o->m_msg_type)._M_target;
        this_00->m_state = psVar3;
        std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
        operator=(&(this_00->m_handler).m_method,&(o->m_handler).m_method);
        (this_00->m_handler).m_thread_safety = (o->m_handler).m_thread_safety;
        this_00 = this_00 + 1;
      }
      o = o + 1;
      iVar11._M_current = this_00;
    } while (o != psVar1);
  }
LAB_001ff234:
  std::
  vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
  ::_M_erase(&this->m_events,iVar11,
             (this->m_events).
             super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (lVar7 != (long)(this->m_events).
                     super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_events).
                     super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
    paVar2 = mbox->m_obj;
    paVar9 = subscription_storage_t::owner(&this->super_subscription_storage_t);
    UNRECOVERED_JUMPTABLE = paVar2->_vptr_abstract_message_box_t[4];
    (*UNRECOVERED_JUMPTABLE)(paVar2,msg_type,paVar9,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		using namespace std;

		const auto mbox_id = mbox->id();

		const auto old_size = m_events.size();

		m_events.erase(
				remove_if( begin( m_events ), end( m_events ),
						[mbox_id, &msg_type]( const info_t & i ) {
							return i.m_mbox->id() == mbox_id &&
									i.m_msg_type == msg_type;
						} ),
				end( m_events ) );

		// Note: since v.5.5.9 mbox unsubscription is initiated even if
		// it is MPSC mboxes. It is important for the case of message
		// delivery tracing.

		if( old_size != m_events.size() )
			mbox->unsubscribe_event_handlers( msg_type, owner() );
	}